

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void destroy_free<LRQFAstate>(void *temp)

{
  if (*(void **)((long)temp + 8) != (void *)((long)temp + 0x18)) {
    operator_delete(*(void **)((long)temp + 8));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}